

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,QtInstallDirectoryWithTriple>::emplace<QtInstallDirectoryWithTriple_const&>
          (QHash<QString,QtInstallDirectoryWithTriple> *this,QString *key,
          QtInstallDirectoryWithTriple *args)

{
  Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QtInstallDirectoryWithTriple local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)0x0) {
    local_70.qtInstallDirectory.d.d = (Data *)0x0;
LAB_00137978:
    pDVar1 = (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)0x0;
LAB_0013799a:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_>::
             detached(pDVar1);
    *(Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> **)this = pDVar1;
LAB_001379a2:
    pVar2 = (piter)emplace_helper<QtInstallDirectoryWithTriple_const&>(this,key,args);
    QHash<QString,_QtInstallDirectoryWithTriple>::~QHash
              ((QHash<QString,_QtInstallDirectoryWithTriple> *)&local_70);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_70.qtInstallDirectory.d.d = (Data *)pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)0x0)
        goto LAB_00137978;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_0013799a;
      goto LAB_001379a2;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        pVar2 = (piter)emplace_helper<QtInstallDirectoryWithTriple_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_00137ac6;
    }
    local_70.qtInstallDirectory.d.d = (args->qtInstallDirectory).d.d;
    local_70.qtInstallDirectory.d.ptr = (args->qtInstallDirectory).d.ptr;
    local_70.qtInstallDirectory.d.size = (args->qtInstallDirectory).d.size;
    if ((Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)
        local_70.qtInstallDirectory.d.d !=
        (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)0x0) {
      LOCK();
      (((QArrayData *)
       &((Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)
        local_70.qtInstallDirectory.d.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)
            &((Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)
             local_70.qtInstallDirectory.d.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_70.qtDirectories.d = (args->qtDirectories).d;
    if ((local_70.qtDirectories.d != (Data *)0x0) &&
       (((local_70.qtDirectories.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      ((local_70.qtDirectories.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_70.qtDirectories.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_70.triple.d.d = (args->triple).d.d;
    local_70.triple.d.ptr = (args->triple).d.ptr;
    local_70.triple.d.size = (args->triple).d.size;
    if (&(local_70.triple.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_70.triple.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_70.triple.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_70.enabled = args->enabled;
    pVar2 = (piter)QHash<QString,_QtInstallDirectoryWithTriple>::
                   emplace_helper<QtInstallDirectoryWithTriple>
                             ((QHash<QString,_QtInstallDirectoryWithTriple> *)this,key,&local_70);
    if (&(local_70.triple.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.triple.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.triple.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_70.triple.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_70.triple.d.d)->super_QArrayData,2,0x10);
      }
    }
    QHash<QString,_QString>::~QHash(&local_70.qtDirectories);
    if ((Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)
        local_70.qtInstallDirectory.d.d !=
        (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)0x0) {
      LOCK();
      (((RefCount *)&(local_70.qtInstallDirectory.d.d)->super_QArrayData)->atomic)._q_value.
      super___atomic_base<int>._M_i =
           (((RefCount *)&(local_70.qtInstallDirectory.d.d)->super_QArrayData)->atomic)._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((RefCount *)&(local_70.qtInstallDirectory.d.d)->super_QArrayData)->atomic)._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.qtInstallDirectory.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (iterator)pVar2;
  }
LAB_00137ac6:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }